

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-cpu.c
# Opt level: O1

thread_ret_t ggml_graph_compute_secondary_thread(void *data)

{
  uint uVar1;
  int iVar2;
  pthread_mutex_t *__mutex;
  pthread_mutex_t *__mutex_00;
  long lVar3;
  uint64_t i;
  ulong uVar4;
  ulong uVar5;
  char cVar6;
  ggml_threadpool *threadpool;
  
  __mutex = *(pthread_mutex_t **)((long)data + 0x210);
  ggml_thread_apply_priority(*(int32_t *)((long)__mutex + 0x120));
  if (*(char *)((long)data + 8) == '\0') {
    uVar5 = 0;
    do {
      uVar4 = uVar5;
      if (uVar4 == 0x1ff) break;
      uVar5 = uVar4 + 1;
    } while (*(char *)((long)data + uVar4 + 9) != '\x01');
    if (0x1fe < uVar4) goto LAB_001102ba;
  }
  ggml_thread_apply_affinity((_Bool *)((long)data + 8));
LAB_001102ba:
  do {
    while ((*(byte *)((long)__mutex + 0x105) & 1) != 0) {
      pthread_mutex_lock(__mutex);
      if ((*(byte *)((long)__mutex + 0x105) & 1) != 0) {
        pthread_cond_wait((pthread_cond_t *)(__mutex + 1),__mutex);
      }
      pthread_mutex_unlock(__mutex);
    }
    if ((*(byte *)((long)__mutex + 0x104) & 1) != 0) {
      return (thread_ret_t)0x0;
    }
    __mutex_00 = *(pthread_mutex_t **)((long)data + 0x210);
    if (*(int *)((long)data + 0x218) < *(int *)((long)__mutex_00 + 0x11c)) {
      uVar1 = *(uint *)((long)__mutex_00 + 0x124);
      uVar5 = 0;
      while( true ) {
        cVar6 = '\x01';
        if (((*(char *)((long)data + 0x20c) == '\0') &&
            (lVar3 = *(long *)((long)data + 0x210), (*(byte *)(lVar3 + 0x104) & 1) == 0)) &&
           ((*(byte *)(lVar3 + 0x105) & 1) == 0)) {
          iVar2 = *(int *)(lVar3 + 0x68);
          if (iVar2 != *(int *)((long)data + 0x208)) {
            *(bool *)((long)data + 0x20c) =
                 *(int *)((long)data + 0x218) < *(int *)(*(long *)((long)data + 0x210) + 0x11c);
            *(int *)((long)data + 0x208) = iVar2;
          }
          cVar6 = *(char *)((long)data + 0x20c);
        }
        if ((cVar6 != '\0') || ((ulong)uVar1 << 0x11 <= uVar5)) break;
        uVar5 = uVar5 + 1;
      }
    }
    if (*(char *)((long)data + 0x20c) != '\x01') {
      pthread_mutex_lock(__mutex_00);
      if (*(char *)((long)data + 0x20c) == '\0') {
        while ((lVar3 = *(long *)((long)data + 0x210), (*(byte *)(lVar3 + 0x104) & 1) == 0 &&
               ((*(byte *)(lVar3 + 0x105) & 1) == 0))) {
          iVar2 = *(int *)(lVar3 + 0x68);
          if (iVar2 != *(int *)((long)data + 0x208)) {
            *(bool *)((long)data + 0x20c) =
                 *(int *)((long)data + 0x218) < *(int *)(*(long *)((long)data + 0x210) + 0x11c);
            *(int *)((long)data + 0x208) = iVar2;
          }
          if ((*(char *)((long)data + 0x20c) != '\0') ||
             (pthread_cond_wait((pthread_cond_t *)(__mutex_00 + 1),__mutex_00),
             *(char *)((long)data + 0x20c) == '\x01')) break;
        }
      }
      pthread_mutex_unlock(__mutex_00);
    }
    if (*(char *)((long)data + 0x20c) == '\x01') {
      *(undefined1 *)((long)data + 0x20c) = 0;
      ggml_graph_compute_thread(data);
    }
  } while( true );
}

Assistant:

static thread_ret_t ggml_graph_compute_secondary_thread(void* data) {
    struct ggml_compute_state * state = (struct ggml_compute_state *) data;
    struct ggml_threadpool * threadpool = state->threadpool;

    ggml_thread_apply_priority(threadpool->prio);
    if (ggml_thread_cpumask_is_valid(state->cpumask)) {
        ggml_thread_apply_affinity(state->cpumask);
    }

    while (true) {
        // Check if we need to sleep
        while (threadpool->pause) {
            GGML_PRINT_DEBUG("thread #%d inside pause loop\n", state->ith);
            ggml_mutex_lock_shared(&threadpool->mutex);
            if (threadpool->pause) {
                ggml_cond_wait(&threadpool->cond, &threadpool->mutex);
            }
            GGML_PRINT_DEBUG("thread #%d resuming after wait\n", state->ith);
            ggml_mutex_unlock_shared(&threadpool->mutex);
        }

        // This needs to be checked for after the cond_wait
        if (threadpool->stop) break;

        // Check if there is new work
        // The main thread is the only one that can dispatch new work

        ggml_graph_compute_check_for_work(state);
        if (state->pending) {
            state->pending = false;

            ggml_graph_compute_thread(state);
        }
    }

    return (thread_ret_t) 0;
}